

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeGuard.hpp
# Opt level: O0

void __thiscall
Lib::
ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/BackwardSubsumptionDemodulation.cpp:309:5)>
::execute(ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
          *this)

{
  bool bVar1;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
  *in_RDI;
  anon_class_1_0_00000001_for_f *in_stack_fffffffffffffff0;
  
  in_RDI->active = false;
  bVar1 = stackUnwindingInProgress(in_RDI);
  if (bVar1) {
    anon_class_1_0_00000001_for_f::operator()(in_stack_fffffffffffffff0);
  }
  else {
    anon_class_1_0_00000001_for_f::operator()(in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void execute() noexcept(noexcept(std::declval<Callable>()))
    {
      active = false;
      if (!stackUnwindingInProgress()) {
        // ~ScopeGuard called normally
        f();
      } else {
        // ~ScopeGuard called during stack unwinding (this means we must not throw an exception)
        try {
          f();
        }
        catch(...) {
          /* do nothing */
          // TODO
          // It's bad to just swallow exceptions silently, but if it's just some not-so-important cleanup function we might not care.
          // For more important cases, maybe we should add a parameter that controls what to do in this case: terminate, ignore, something else???
          // std::terminate();

#if VDEBUG
          // In debug mode, just terminate so we notice there's a problem.
          std::cerr << "Exception in ~ScopeGuard during stack unwinding!" << std::endl;
          ASSERTION_VIOLATION;
#endif
        }
      }
    }